

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLCellLinOp::getSolvabilityOffset
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MLCellLinOp *this,
          int amrlev,int mglev,Any *a_rhs)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  Real RVar5;
  allocator_type local_41;
  MultiFab *local_40;
  MultiFab *local_38;
  
  local_40 = Any::get<amrex::MultiFab>(a_rhs);
  computeVolInv(this);
  uVar1 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,(long)(int)uVar1
             ,&local_41);
  lVar3 = (long)mglev;
  lVar2 = *(long *)(*(long *)&(this->super_MLLinOp).m_factory.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                   + lVar3 * 8);
  if ((lVar2 == 0) ||
     (lVar2 = __dynamic_cast(lVar2,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo), lVar2 == 0)) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        RVar5 = MultiFab::sum(local_40,(int)uVar4,true);
        (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar4] = RVar5 * *(double *)
                           (*(long *)&(this->m_volinv).
                                      super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                      super_vector<double,_std::allocator<double>_>.
                                      super__Vector_base<double,_std::allocator<double>_> +
                           lVar3 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    local_38 = EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar2 + 0xd8));
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        RVar5 = MultiFab::Dot(local_40,(int)uVar4,local_38,0,1,0,true);
        (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar4] = RVar5 * *(double *)
                           (*(long *)&(this->m_volinv).
                                      super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                      super_vector<double,_std::allocator<double>_>.
                                      super__Vector_base<double,_std::allocator<double>_> +
                           lVar3 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
MLCellLinOp::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto const& rhs = a_rhs.get<MultiFab>();

    computeVolInv();

    const int ncomp = getNComp();
    Vector<Real> offset(ncomp);

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(amrlev,mglev));
    if (factory)
    {
        const MultiFab& vfrac = factory->getVolFrac();
        for (int c = 0; c < ncomp; ++c) {
            offset[c] = MultiFab::Dot(rhs, c, vfrac, 0, 1, 0, true) * m_volinv[amrlev][mglev];
        }
    }
    else
#endif
    {
        for (int c = 0; c < ncomp; ++c) {
            offset[c] = rhs.sum(c,true) * m_volinv[amrlev][mglev];
        }
    }

    ParallelAllReduce::Sum(offset.data(), ncomp, ParallelContext::CommunicatorSub());

    return offset;
}